

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::GenerateArgOutForStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  LowererMDArch *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  RegOpnd *pRVar9;
  LabelInstr *branchTarget;
  IntConstOpnd *pIVar10;
  BranchInstr *pBVar11;
  LabelInstr *this_01;
  Loop *pLVar12;
  LabelInstr *branchTarget_00;
  Instr *pIVar13;
  IndirOpnd *pIVar14;
  Instr *stackArgsInstr_00;
  undefined1 local_d0 [8];
  AutoReuseOpnd autoReuseLdLenDstOpnd;
  AutoReuseOpnd autoReuseldElemDstOpnd;
  AutoReuseOpnd autoReuseldElemDstOpnd3;
  AutoReuseOpnd autoReuseldElemDstOpnd2;
  
  if (stackArgsInstr->m_opcode != ArgOut_A_FromStackArgs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5586,"(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)",
                       "stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs");
    if (!bVar2) goto LAB_0057ea74;
    *puVar4 = 0;
  }
  if (callInstr->m_opcode != CallIDynamic) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5587,"(callInstr->m_opcode == Js::OpCode::CallIDynamic)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamic");
    if (!bVar2) {
LAB_0057ea74:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pRVar5 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
  this_00 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::GenerateFunctionObjectTest(this_00,callInstr,pRVar5,false,(LabelInstr *)0x0);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    pOVar6 = GenerateArgOutForInlineeStackArgs(this,callInstr,stackArgsInstr_00);
    return pOVar6;
  }
  func = callInstr->m_func;
  pRVar5 = IR::Opnd::AsRegOpnd(stackArgsInstr->m_src1);
  pRVar7 = IR::RegOpnd::New(TyInt64,func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_d0,&pRVar7->super_Opnd,func,true);
  pIVar8 = IR::Instr::New(LdLen_A,&pRVar7->super_Opnd,&pRVar5->super_Opnd,func);
  VVar3 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(&pRVar7->super_Opnd,VVar3);
  IR::Instr::InsertBefore(callInstr,pIVar8);
  GenerateFastRealStackArgumentsLdLen(this,pIVar8);
  pRVar9 = IR::RegOpnd::New(TyInt64,func);
  pIVar8 = IR::Instr::New(MOV,&pRVar9->super_Opnd,&pRVar7->super_Opnd,func);
  pOVar6 = pIVar8->m_dst;
  VVar3 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(pOVar6,VVar3);
  IR::Instr::InsertBefore(callInstr,pIVar8);
  branchTarget = IR::LabelInstr::New(Label,func,false);
  pIVar10 = IR::IntConstOpnd::New(0,TyInt8,func,false);
  pBVar11 = IR::BranchInstr::New(BrEq_I4,branchTarget,&pRVar7->super_Opnd,&pIVar10->super_Opnd,func)
  ;
  IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
  LowererMD::EmitInt4Instr(&pBVar11->super_Instr);
  this_01 = InsertLoopTopLabel(this,callInstr);
  pLVar12 = IR::LabelInstr::GetLoop(this_01);
  branchTarget_00 = IR::LabelInstr::New(Label,func,false);
  pIVar10 = IR::IntConstOpnd::New(1,TyInt8,func,false);
  pBVar11 = IR::BranchInstr::New
                      (BrLe_I4,branchTarget_00,&pRVar7->super_Opnd,&pIVar10->super_Opnd,func);
  IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
  LowererMD::EmitInt4Instr(&pBVar11->super_Instr);
  pIVar10 = IR::IntConstOpnd::New(1,TyInt64,func,false);
  pIVar13 = IR::Instr::New(Sub_I4,&pRVar7->super_Opnd,&pRVar7->super_Opnd,&pIVar10->super_Opnd,func)
  ;
  IR::Instr::InsertBefore(callInstr,pIVar13);
  LowererMD::EmitInt4Instr(pIVar13);
  pIVar14 = IR::IndirOpnd::New(pRVar5,pRVar7,TyInt64,func);
  pRVar9 = IR::RegOpnd::New(TyInt64,func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseLdLenDstOpnd.autoDelete,&pRVar9->super_Opnd,func,true);
  pIVar13 = IR::Instr::New(LdElemI_A,&pRVar9->super_Opnd,&pIVar14->super_Opnd,func);
  IR::Instr::InsertBefore(callInstr,pIVar13);
  GenerateFastStackArgumentsLdElemI(this,pIVar13);
  pIVar13 = IR::Instr::New(ArgOut_A_Dynamic,func);
  IR::Instr::SetSrc1(pIVar13,&pRVar9->super_Opnd);
  IR::Instr::SetSrc2(pIVar13,&pRVar7->super_Opnd);
  IR::Instr::InsertBefore(callInstr,pIVar13);
  LowererMDArch::LoadDynamicArgumentUsingLength(this_00,pIVar13);
  pBVar11 = IR::BranchInstr::New(JMP,this_01,func);
  IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
  IR::Instr::InsertBefore(callInstr,&branchTarget_00->super_Instr);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar12->regAlloc).liveOnBackEdgeSyms,(pRVar7->m_sym->super_Sym).m_id);
  pRVar7 = IR::RegOpnd::New(TyInt32,func);
  VVar3 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(&pRVar7->super_Opnd,VVar3);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseldElemDstOpnd.autoDelete,&pRVar7->super_Opnd,func,true);
  pIVar10 = IR::IntConstOpnd::New(0,TyInt8,func,true);
  InsertMove(&pRVar7->super_Opnd,&pIVar10->super_Opnd,callInstr,true);
  pIVar14 = IR::IndirOpnd::New(pRVar5,pRVar7,TyInt64,func);
  pRVar5 = IR::RegOpnd::New(TyInt64,func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseldElemDstOpnd3.autoDelete,&pRVar5->super_Opnd,func,true);
  pIVar13 = IR::Instr::New(LdElemI_A,&pRVar5->super_Opnd,&pIVar14->super_Opnd,func);
  IR::Instr::InsertBefore(callInstr,pIVar13);
  GenerateFastStackArgumentsLdElemI(this,pIVar13);
  pIVar13 = IR::Instr::New(ArgOut_A_Dynamic,func);
  IR::Instr::SetSrc1(pIVar13,&pRVar5->super_Opnd);
  IR::Instr::InsertBefore(callInstr,pIVar13);
  LowererMDArch::LoadDynamicArgument(this_00,pIVar13,4);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseldElemDstOpnd3.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseldElemDstOpnd.autoDelete);
  IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
  pRVar5 = IR::Opnd::AsRegOpnd(pIVar8->m_dst);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseLdLenDstOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_d0);
  return &pRVar5->super_Opnd;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{

// For architectures were we only pass 4 parameters in registers, the
// generated code looks something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrEq_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrEq_I4          $L4, s25.var,1                    // Loop through the rest of the arguments, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    s25.var       = LdImm             0                                // set s25 to 0, since it'll be 1 on the way into this block
//    s10.var       = LdElemI_A         [s4.var + 0 * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, 4
//    $L3:
//
// Generalizing this for more register-passed parameters gives us code
// something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrLe_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrLe_I4          $L4, s25.var,INT_REG_COUNT-3      // Loop through the rest of the arguments up to the number passed in registers, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 1 (0 omitted as we know that it'll be at least one register argument):
//                    BrEq_I4          $L__N, s25.var, N
//    end foreach
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 0:
//    $L__N:
//    s10.var       = LdElemI_A         [s4.var + N * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, N+3
//    end foreach
//    $L3:


#if defined(_M_IX86)
    // We get a compilation error on x86 due to assigning a negative to a uint
    // TODO: don't even define this function on x86 - we Assert(false) anyway there.
    // Alternatively, don't define when INT_ARG_REG_COUNT - 4 < 0
    AssertOrFailFast(false);
    return nullptr;
#else

    Assert(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamic);

    this->m_lowererMD.GenerateFunctionObjectTest(callInstr, callInstr->GetSrc1()->AsRegOpnd(), false);

    if (callInstr->m_func->IsInlinee())
    {
        return this->GenerateArgOutForInlineeStackArgs(callInstr, stackArgsInstr);
    }
    Func *func = callInstr->m_func;
    IR::RegOpnd* stackArgs = stackArgsInstr->GetSrc1()->AsRegOpnd();

    IR::RegOpnd* ldLenDstOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseLdLenDstOpnd(ldLenDstOpnd, func);
    IR::Instr* ldLen = IR::Instr::New(Js::OpCode::LdLen_A, ldLenDstOpnd ,stackArgs, func);
    ldLenDstOpnd->SetValueType(ValueType::GetTaggedInt()); /*LdLen_A works only on stack arguments*/
    callInstr->InsertBefore(ldLen);
    GenerateFastRealStackArgumentsLdLen(ldLen);

    IR::Instr* saveLenInstr = IR::Instr::New(Js::OpCode::MOV, IR::RegOpnd::New(TyMachReg, func), ldLenDstOpnd, func);
    saveLenInstr->GetDst()->SetValueType(ValueType::GetTaggedInt());
    callInstr->InsertBefore(saveLenInstr);

    IR::LabelInstr* doneArgs = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Instr* branchDoneArgs = IR::BranchInstr::New(Js::OpCode::BrEq_I4, doneArgs, ldLenDstOpnd, IR::IntConstOpnd::New(0, TyInt8, func),func);
    callInstr->InsertBefore(branchDoneArgs);
    this->m_lowererMD.EmitInt4Instr(branchDoneArgs);

    IR::LabelInstr* startLoop = InsertLoopTopLabel(callInstr);
    Loop * loop = startLoop->GetLoop();
    IR::LabelInstr* endLoop = IR::LabelInstr::New(Js::OpCode::Label, func);

    IR::Instr* branchOutOfLoop = IR::BranchInstr::New(Js::OpCode::BrLe_I4, endLoop, ldLenDstOpnd, IR::IntConstOpnd::New(INT_ARG_REG_COUNT - 3, TyInt8, func),func);
    callInstr->InsertBefore(branchOutOfLoop);
    this->m_lowererMD.EmitInt4Instr(branchOutOfLoop);

    IR::Instr* subInstr = IR::Instr::New(Js::OpCode::Sub_I4, ldLenDstOpnd, ldLenDstOpnd, IR::IntConstOpnd::New(1, TyMachReg, func),func);
    callInstr->InsertBefore(subInstr);
    this->m_lowererMD.EmitInt4Instr(subInstr);

    IR::IndirOpnd *nthArgument = IR::IndirOpnd::New(stackArgs, ldLenDstOpnd, TyMachReg, func);
    IR::RegOpnd* ldElemDstOpnd = IR::RegOpnd::New(TyMachReg,func);
    const IR::AutoReuseOpnd autoReuseldElemDstOpnd(ldElemDstOpnd, func);
    IR::Instr* ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
    callInstr->InsertBefore(ldElem);
    GenerateFastStackArgumentsLdElemI(ldElem);

    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
    argout->SetSrc1(ldElemDstOpnd);
    argout->SetSrc2(ldLenDstOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgumentUsingLength(argout);

    IR::BranchInstr *tailBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, startLoop, func);
    callInstr->InsertBefore(tailBranch);

    callInstr->InsertBefore(endLoop);

    loop->regAlloc.liveOnBackEdgeSyms->Set(ldLenDstOpnd->m_sym->m_id);

    // Note: This loop iteratively adds instructions in two locations; in the block
    // of branches that jump to the "load elements to argOuts" instructions, and in
    // the the block of load elements to argOuts instructions themselves.

    // 4 to denote this is 4th register after this, callinfo & function object
    // INT_ARG_REG_COUNT is the number of parameters passed in int regs
    uint current_reg_pass = INT_ARG_REG_COUNT - 4;

    do
    {
        // If we're on this pass we know we have to do at least one of these, so skip
        // the branch if we're on the last one.
        if (current_reg_pass != INT_ARG_REG_COUNT - 4)
        {
            IR::LabelInstr* loadBlockLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            IR::Instr* branchToBlock = IR::BranchInstr::New(Js::OpCode::BrEq_I4, loadBlockLabel, ldLenDstOpnd, IR::IntConstOpnd::New(current_reg_pass + 1, TyInt8, func), func);
            endLoop->InsertAfter(branchToBlock);
            callInstr->InsertBefore(loadBlockLabel);
        }

        // TODO: We can further optimize this with a GenerateFastStackArgumentsLdElemI that can
        // handle us passing along constant argument references and encode them into the offset
        // instead of having to use an IndirOpnd; this would allow us to save a few bytes here,
        // and reduce register pressure a hair

        // stemp.var = LdImm current_reg_pass
        IR::RegOpnd* localTemp = IR::RegOpnd::New(TyInt32, func);
        // We need to make it a tagged int because GenerateFastStackArgumentsLdElemI asserts if
        // it is not.
        localTemp->SetValueType(ValueType::GetTaggedInt());
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd3(localTemp, func);
        this->InsertMove(localTemp, IR::IntConstOpnd::New(current_reg_pass, TyInt8, func, true), callInstr);

        // sTemp = LdElem_I   [s4.var + current_reg_pass (aka stemp.var) ]
        nthArgument = IR::IndirOpnd::New(stackArgs, localTemp, TyMachReg, func);
        ldElemDstOpnd = IR::RegOpnd::New(TyMachReg, func);
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd2(ldElemDstOpnd, func);
        ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
        callInstr->InsertBefore(ldElem);
        GenerateFastStackArgumentsLdElemI(ldElem);

        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(ldElemDstOpnd);
        callInstr->InsertBefore(argout);
        this->m_lowererMD.LoadDynamicArgument(argout, current_reg_pass + 4);
    }
    while (current_reg_pass-- != 0);

    callInstr->InsertBefore(doneArgs);

    /*return the length which will be used for callInfo generations & stack allocation*/
    return saveLenInstr->GetDst()->AsRegOpnd();
#endif
}